

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

int NALUnit::calcNalLenInBits(uint8_t *nalBuffer,uint8_t *end)

{
  int iVar1;
  byte bVar2;
  
  iVar1 = 0;
  if (nalBuffer < end) {
    iVar1 = ~((int)nalBuffer << 3) + (int)end * 8;
    for (bVar2 = end[-1] | 0x80; (bVar2 & 1) == 0; bVar2 = bVar2 >> 1) {
      iVar1 = iVar1 + -1;
    }
  }
  return iVar1;
}

Assistant:

int NALUnit::calcNalLenInBits(const uint8_t* nalBuffer, const uint8_t* end)
{
    if (end > nalBuffer)
    {
        int trailing = 1;
        uint8_t data = end[-1] | 0x80;
        while ((data & 1) == 0)
        {
            data >>= 1;
            trailing++;
        }
        return static_cast<int>(end - nalBuffer) * 8 - trailing;
    }
    return 0;
}